

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this,long w,long h,long d)

{
  uchar *puVar1;
  uchar **ppuVar2;
  uchar ***pppuVar3;
  long lVar4;
  runtime_error *this_00;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (((this->width != w) || (this->height != h)) || (this->depth != d)) {
    if (this->n < 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Cannot change size, because image is used as a wrapper");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->pixel != (uchar *)0x0) {
      operator_delete__(this->pixel);
    }
    if (this->row != (uchar **)0x0) {
      operator_delete__(this->row);
    }
    if (this->img != (uchar ***)0x0) {
      operator_delete__(this->img);
    }
    uVar5 = (uint)d;
    this->depth = uVar5;
    this->width = w;
    this->height = h;
    uVar6 = (long)(int)uVar5 * h * w;
    this->n = uVar6;
    this->pixel = (uchar *)0x0;
    this->row = (uchar **)0x0;
    this->img = (uchar ***)0x0;
    if (0 < (long)uVar6) {
      uVar7 = (int)uVar5 * h;
      puVar1 = (uchar *)operator_new__(uVar6);
      this->pixel = puVar1;
      ppuVar2 = (uchar **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
      this->row = ppuVar2;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (int)uVar5) {
        uVar6 = (long)(int)uVar5 << 3;
      }
      pppuVar3 = (uchar ***)operator_new__(uVar6);
      this->img = pppuVar3;
      *ppuVar2 = puVar1;
      if (1 < (long)uVar7) {
        lVar4 = 1;
        do {
          this->row[lVar4] = this->row[lVar4 + -1] + w;
          lVar4 = lVar4 + 1;
        } while (uVar7 - lVar4 != 0);
      }
      *this->img = this->row;
      if (1 < (int)uVar5) {
        uVar6 = 1;
        do {
          this->img[uVar6] = this->img[uVar6 - 1] + h;
          uVar6 = uVar6 + 1;
        } while ((uVar5 & 0x7fffffff) != uVar6);
      }
    }
  }
  return;
}

Assistant:

void setSize(long w, long h, long d)
    {
      if (width != w || height != h || depth != d)
      {
        if (n < 0)
        {
          throw std::runtime_error("Cannot change size, because image is used as a wrapper");
        }

        if (pixel != 0)
        {
          delete [] pixel;
        }

        if (row != 0)
        {
          delete [] row;
        }

        if (img != 0)
        {
          delete [] img;
        }

        depth=d;
        width=w;
        height=h;
        n=width*height*depth;

        pixel=0;
        row=0;
        img=0;

        if (n > 0)
        {
          long m=height*depth;

          pixel=new T[n];
          row=new T*[m];
          img=new T **[depth];

          row[0]=pixel;

          for (long k=1; k<m; k++)
          {
            row[k]=row[k-1]+width;
          }

          img[0]=row;

          for (int j=1; j<depth; j++)
          {
            img[j]=img[j-1]+height;
          }
        }
      }
    }